

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::_mv
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  bool bVar1;
  error_flags eVar2;
  void *in_RSI;
  void *in_RDI;
  char (*in_stack_fffffffffffffef8) [47];
  size_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  Location *in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff50) [47];
  size_t sStack_a8;
  char *in_stack_ffffffffffffff60;
  Location *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [47];
  size_t in_stack_ffffffffffffff80;
  char *local_78;
  Location *pLStack_70;
  char (*local_60) [47];
  size_t sStack_58;
  char *local_50;
  Location *pLStack_48;
  char (*local_38) [47];
  size_t sStack_30;
  char *local_28;
  Location *pLStack_20;
  
  if (*(void **)((long)in_RSI + 0x980) == in_RSI) {
    if (0x10 < *(ulong *)((long)in_RSI + 0x990)) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 = in_stack_ffffffffffffff80;
      in_stack_fffffffffffffef8 = in_stack_ffffffffffffff78;
      loc_01.super_LineCol.line = (size_t)in_stack_ffffffffffffff68;
      loc_01.super_LineCol.offset = (size_t)in_stack_ffffffffffffff60;
      loc_01.super_LineCol.col = in_stack_ffffffffffffff70;
      loc_01.name.str = *in_stack_fffffffffffffef8;
      loc_01.name.len = in_stack_ffffffffffffff00;
      in_stack_ffffffffffffff78 = in_stack_fffffffffffffef8;
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff00;
      error<36ul>((char (*) [36])in_stack_ffffffffffffff50,loc_01);
      in_stack_ffffffffffffff08 = local_78;
      in_stack_ffffffffffffff10 = pLStack_70;
    }
    if (*(ulong *)((long)in_RSI + 0x990) < *(ulong *)((long)in_RSI + 0x988)) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff10 = in_stack_ffffffffffffff68;
      in_stack_ffffffffffffff08 = in_stack_ffffffffffffff60;
      in_stack_fffffffffffffef8 = in_stack_ffffffffffffff50;
      loc_02.super_LineCol.line = (size_t)in_stack_ffffffffffffff10;
      loc_02.super_LineCol.offset = (size_t)in_stack_ffffffffffffff08;
      loc_02.super_LineCol.col = in_stack_ffffffffffffff70;
      loc_02.name.str = *in_stack_ffffffffffffff78;
      loc_02.name.len = in_stack_ffffffffffffff80;
      in_stack_ffffffffffffff50 = in_stack_fffffffffffffef8;
      in_stack_ffffffffffffff60 = in_stack_ffffffffffffff08;
      in_stack_ffffffffffffff68 = in_stack_ffffffffffffff10;
      error<47ul>(in_stack_fffffffffffffef8,loc_02);
      in_stack_ffffffffffffff00 = sStack_a8;
    }
    memcpy(in_RDI,in_RSI,*(long *)((long)in_RSI + 0x988) * 0x98);
    *(void **)((long)in_RDI + 0x980) = in_RDI;
  }
  else {
    if (*(ulong *)((long)in_RSI + 0x990) < 0x11) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff68;
      loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff60;
      loc.super_LineCol.col = in_stack_ffffffffffffff70;
      loc.name.str = *in_stack_ffffffffffffff78;
      loc.name.len = in_stack_ffffffffffffff80;
      error<35ul>((char (*) [35])in_stack_ffffffffffffff50,loc);
      in_stack_fffffffffffffef8 = local_38;
      in_stack_ffffffffffffff00 = sStack_30;
      in_stack_ffffffffffffff08 = local_28;
      in_stack_ffffffffffffff10 = pLStack_20;
    }
    if (*(ulong *)((long)in_RSI + 0x990) < *(ulong *)((long)in_RSI + 0x988)) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      loc_00.super_LineCol.line = (size_t)in_stack_ffffffffffffff68;
      loc_00.super_LineCol.offset = (size_t)in_stack_ffffffffffffff60;
      loc_00.super_LineCol.col = in_stack_ffffffffffffff70;
      loc_00.name.str = *in_stack_ffffffffffffff78;
      loc_00.name.len = in_stack_ffffffffffffff80;
      error<47ul>(in_stack_ffffffffffffff50,loc_00);
      in_stack_fffffffffffffef8 = local_60;
      in_stack_ffffffffffffff00 = sStack_58;
      in_stack_ffffffffffffff08 = local_50;
      in_stack_ffffffffffffff10 = pLStack_48;
    }
    *(undefined8 *)((long)in_RDI + 0x980) = *(undefined8 *)((long)in_RSI + 0x980);
  }
  *(undefined8 *)((long)in_RDI + 0x988) = *(undefined8 *)((long)in_RSI + 0x988);
  *(undefined8 *)((long)in_RDI + 0x990) = *(undefined8 *)((long)in_RSI + 0x990);
  *(undefined8 *)((long)in_RDI + 0x998) = *(undefined8 *)((long)in_RSI + 0x998);
  *(undefined8 *)((long)in_RDI + 0x9a0) = *(undefined8 *)((long)in_RSI + 0x9a0);
  *(undefined8 *)((long)in_RDI + 0x9a8) = *(undefined8 *)((long)in_RSI + 0x9a8);
  *(undefined8 *)((long)in_RDI + 0x9b0) = *(undefined8 *)((long)in_RSI + 0x9b0);
  if (*(void **)((long)in_RSI + 0x980) == in_RDI) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00
                       ,(size_t)in_stack_fffffffffffffef8);
    loc_03.super_LineCol.line = (size_t)in_stack_ffffffffffffff68;
    loc_03.super_LineCol.offset = (size_t)in_stack_ffffffffffffff60;
    loc_03.super_LineCol.col = in_stack_ffffffffffffff70;
    loc_03.name.str = *in_stack_ffffffffffffff78;
    loc_03.name.len = in_stack_ffffffffffffff80;
    error<37ul>((char (*) [37])in_stack_ffffffffffffff50,loc_03);
  }
  *(void **)((long)in_RSI + 0x980) = in_RSI;
  *(undefined8 *)((long)in_RSI + 0x990) = 0x10;
  *(undefined8 *)((long)in_RSI + 0x988) = 0;
  return;
}

Assistant:

void stack<T, N>::_mv(stack * that)
{
    if(that->m_stack != that->m_buf)
    {
        RYML_ASSERT(that->m_capacity > N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
        m_stack = that->m_stack;
    }
    else
    {
        RYML_ASSERT(that->m_capacity <= N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
        memcpy(m_buf, that->m_buf, that->m_size * sizeof(T));
        m_stack = m_buf;
    }
    m_size = that->m_size;
    m_capacity = that->m_capacity;
    m_callbacks = that->m_callbacks;
    // make sure no deallocation happens on destruction
    RYML_ASSERT(that->m_stack != m_buf);
    that->m_stack = that->m_buf;
    that->m_capacity = N;
    that->m_size = 0;
}